

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O1

type unodb::qsbr_state::inc_thread_count(type word)

{
  bool bVar1;
  type tVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  qsbr_epoch local_31;
  
  uVar5 = (uint)((word & 0x3fffffff3fffffff) >> 0x20);
  uVar3 = (uint)(word & 0x3fffffff3fffffff);
  if (uVar3 <= uVar5) {
    tVar2 = word + 0x100000000;
    uVar4 = (uint)(tVar2 >> 0x20) & 0x3fffffff;
    uVar6 = (uint)word & 0x3fffffff;
    if (uVar6 <= uVar4) {
      bVar1 = detail::qsbr_epoch::operator==(&local_31,(qsbr_epoch)(epoch_type)(tVar2 >> 0x3e));
      if (!bVar1) {
        __assert_fail("get_epoch(word) == get_epoch(result)",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                      ,0x117,"static type unodb::qsbr_state::inc_thread_count(type)");
      }
      if (uVar3 == uVar6) {
        if (uVar5 + 1 == uVar4) {
          return tVar2;
        }
        __assert_fail("get_thread_count(word) + 1 == get_thread_count(result)",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                      ,0x11a,"static type unodb::qsbr_state::inc_thread_count(type)");
      }
      __assert_fail("get_threads_in_previous_epoch(word) == get_threads_in_previous_epoch(result)",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                    ,0x119,"static type unodb::qsbr_state::inc_thread_count(type)");
    }
  }
  __assert_fail("threads_in_previous <= thread_count",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
}

Assistant:

[[nodiscard, gnu::const]] static constexpr type inc_thread_count(
      type word) noexcept {
    assert_invariants(word);

    const auto result = word + one_thread_in_count;

    assert_invariants(result);
    UNODB_DETAIL_ASSERT(get_epoch(word) == get_epoch(result));
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) ==
                        get_threads_in_previous_epoch(result));
    UNODB_DETAIL_ASSERT(get_thread_count(word) + 1 == get_thread_count(result));

    return result;
  }